

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# include.hpp
# Opt level: O0

void update_lcp<unsigned_long>
               (sa_node_n *x,vector<unsigned_long,_std::allocator<unsigned_long>_> *LCP,
               uint64_t *lcp_values)

{
  value_type vVar1;
  sa_node_n N;
  sa_node_n N_00;
  sa_node_n N_01;
  sa_node_n N_02;
  sa_node_n N_03;
  bool bVar2;
  reference pvVar3;
  long *in_RDX;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  void *in_RDI;
  unsigned_long nil;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  uint64_t uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  uint64_t uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  uint64_t uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  uint64_t uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  uint64_t uStack_28;
  undefined8 local_20;
  long *local_18;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_10;
  void *local_8;
  
  local_20 = 0xffffffffffffffff;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memcpy(&local_60,in_RDI,0x40);
  N.first_A = uStack_58;
  N.first_TERM = local_60;
  N.first_C = local_50;
  N.first_G = uStack_48;
  N.first_N = local_40;
  N.first_T = uStack_38;
  N.last = local_30;
  N.depth = uStack_28;
  bVar2 = has_child_TERM(N);
  if ((bVar2) && (*(long *)((long)local_8 + 8) != *(long *)((long)local_8 + 0x30))) {
    vVar1 = *(value_type *)((long)local_8 + 0x38);
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (local_10,*(size_type *)((long)local_8 + 8));
    *pvVar3 = vVar1;
    *local_18 = *local_18 + 1;
  }
  memcpy(&local_a0,local_8,0x40);
  N_00.first_A = uStack_98;
  N_00.first_TERM = local_a0;
  N_00.first_C = local_90;
  N_00.first_G = uStack_88;
  N_00.first_N = local_80;
  N_00.first_T = uStack_78;
  N_00.last = local_70;
  N_00.depth = uStack_68;
  bVar2 = has_child_A(N_00);
  if ((bVar2) && (*(long *)((long)local_8 + 0x10) != *(long *)((long)local_8 + 0x30))) {
    vVar1 = *(value_type *)((long)local_8 + 0x38);
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (local_10,*(size_type *)((long)local_8 + 0x10));
    *pvVar3 = vVar1;
    *local_18 = *local_18 + 1;
  }
  memcpy(&local_e0,local_8,0x40);
  N_01.first_A = uStack_d8;
  N_01.first_TERM = local_e0;
  N_01.first_C = local_d0;
  N_01.first_G = uStack_c8;
  N_01.first_N = local_c0;
  N_01.first_T = uStack_b8;
  N_01.last = local_b0;
  N_01.depth = uStack_a8;
  bVar2 = has_child_C(N_01);
  if ((bVar2) && (*(long *)((long)local_8 + 0x18) != *(long *)((long)local_8 + 0x30))) {
    vVar1 = *(value_type *)((long)local_8 + 0x38);
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (local_10,*(size_type *)((long)local_8 + 0x18));
    *pvVar3 = vVar1;
    *local_18 = *local_18 + 1;
  }
  memcpy(&local_120,local_8,0x40);
  N_02.first_A = uStack_118;
  N_02.first_TERM = local_120;
  N_02.first_C = local_110;
  N_02.first_G = uStack_108;
  N_02.first_N = local_100;
  N_02.first_T = uStack_f8;
  N_02.last = local_f0;
  N_02.depth = uStack_e8;
  bVar2 = has_child_G(N_02);
  if ((bVar2) && (*(long *)((long)local_8 + 0x20) != *(long *)((long)local_8 + 0x30))) {
    vVar1 = *(value_type *)((long)local_8 + 0x38);
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (local_10,*(size_type *)((long)local_8 + 0x20));
    *pvVar3 = vVar1;
    *local_18 = *local_18 + 1;
  }
  memcpy(&local_160,local_8,0x40);
  N_03.first_A = uStack_158;
  N_03.first_TERM = local_160;
  N_03.first_C = local_150;
  N_03.first_G = uStack_148;
  N_03.first_N = local_140;
  N_03.first_T = uStack_138;
  N_03.last = local_130;
  N_03.depth = uStack_128;
  bVar2 = has_child_N(N_03);
  if ((bVar2) && (*(long *)((long)local_8 + 0x28) != *(long *)((long)local_8 + 0x30))) {
    vVar1 = *(value_type *)((long)local_8 + 0x38);
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (local_10,*(size_type *)((long)local_8 + 0x28));
    *pvVar3 = vVar1;
    *local_18 = *local_18 + 1;
  }
  return;
}

Assistant:

void update_lcp(sa_node_n & x, vector<lcp_int_t> & LCP, uint64_t & lcp_values){

	assert(x.first_A >= x.first_TERM);
	assert(x.first_C >= x.first_A);
	assert(x.first_G >= x.first_C);
	assert(x.first_N >= x.first_G);
	assert(x.first_T >= x.first_N);

	assert(number_of_children(x) >= 2);

	lcp_int_t nil = ~lcp_int_t(0);

	if(has_child_TERM(x) and x.first_A != x.last){
		assert(LCP[x.first_A]==nil);
		LCP[x.first_A] = x.depth;
		lcp_values++;
	}
	if(has_child_A(x) and x.first_C != x.last){
		assert(LCP[x.first_C]==nil);
		LCP[x.first_C] = x.depth;
		lcp_values++;
	}
	if(has_child_C(x) and x.first_G != x.last){
		assert(LCP[x.first_G]==nil);
		LCP[x.first_G] = x.depth;
		lcp_values++;
	}
	if(has_child_G(x) and x.first_N != x.last){
		assert(LCP[x.first_N]==nil);
		LCP[x.first_N] = x.depth;
		lcp_values++;
	}
	if(has_child_N(x) and x.first_T != x.last){
		assert(LCP[x.first_T]==nil);
		LCP[x.first_T] = x.depth;
		lcp_values++;
	}

}